

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O1

int onig_get_args_num_by_callout_args(OnigCalloutArgs *args)

{
  int iVar1;
  CalloutListEntry *pCVar2;
  
  pCVar2 = onig_reg_callout_list_at(args->regex,args->num);
  iVar1 = -0x1e;
  if ((pCVar2 != (CalloutListEntry *)0x0) && (pCVar2->of == ONIG_CALLOUT_OF_NAME)) {
    iVar1 = (pCVar2->u).arg.num;
  }
  return iVar1;
}

Assistant:

extern int
onig_get_args_num_by_callout_args(OnigCalloutArgs* args)
{
  int num;
  CalloutListEntry* e;

  num = args->num;
  e = onig_reg_callout_list_at(args->regex, num);
  if (IS_NULL(e)) return ONIGERR_INVALID_ARGUMENT;
  if (e->of == ONIG_CALLOUT_OF_NAME) {
    return e->u.arg.num;
  }

  return ONIGERR_INVALID_ARGUMENT;
}